

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

Input * __thiscall
helics::ValueFederate::getInput(ValueFederate *this,string_view name,int index1,int index2)

{
  ValueFederateManager *this_00;
  Input *pIVar1;
  string_view key;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string_view name_local;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  this_00 = (this->vfManager)._M_t.
            super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
            .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&name_local,&local_111);
  std::operator+(&local_b0,&local_50,'_');
  CLI::std::__cxx11::to_string(&local_d0,index1);
  std::operator+(&local_90,&local_b0,&local_d0);
  std::operator+(&local_70,&local_90,'_');
  CLI::std::__cxx11::to_string(&local_f0,index2);
  std::operator+(&local_110,&local_70,&local_f0);
  key._M_str = local_110._M_dataplus._M_p;
  key._M_len = local_110._M_string_length;
  pIVar1 = ValueFederateManager::getInput(this_00,key);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  return pIVar1;
}

Assistant:

const Input& ValueFederate::getInput(std::string_view name, int index1, int index2) const
{
    return vfManager->getInput(std::string(name) + '_' + std::to_string(index1) + '_' +
                               std::to_string(index2));
}